

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BoundingBoxHelpers.cpp
# Opt level: O1

void __thiscall
iDynTree::BoundingBoxProjectionConstraint::setProjectionAlongDirection
          (BoundingBoxProjectionConstraint *this,Vector3 direction)

{
  *(undefined8 *)&this->Pdirection = 0x3ff0000000000000;
  *(undefined8 *)&this->field_0xa0 = 0;
  *(double *)&this->field_0xa8 = -direction.m_data[0] / direction.m_data[2];
  *(undefined4 *)&this->field_0xb0 = 0;
  *(undefined4 *)&this->field_0xb4 = 0;
  *(undefined4 *)&this->field_0xb8 = 0;
  *(undefined4 *)&this->field_0xbc = 0x3ff00000;
  *(double *)&this->field_0xc0 = -direction.m_data[1] / direction.m_data[2];
  return;
}

Assistant:

void BoundingBoxProjectionConstraint::setProjectionAlongDirection(Vector3 direction)
    {
        Vector3 xProjection, yProjection;

        // define the projection for the x-component
        xProjection.setVal(0, 1.0);
        xProjection.setVal(1, 0.0);
        xProjection.setVal(2, -direction.getVal(0) / direction.getVal(2));

        // define the projection for the y-component
        yProjection.setVal(0, 0.0);
        yProjection.setVal(1, 1.0);
        yProjection.setVal(2, -direction.getVal(1) / direction.getVal(2));

        // fill the projection matrix
        toEigen(Pdirection).block<1, 3>(0,0) = toEigen(xProjection);
        toEigen(Pdirection).block<1, 3>(1,0) = toEigen(yProjection);

    }